

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fortran_array_view.cpp
# Opt level: O0

StaticHypercube<4UL>
cpp_bindgen::adltest::(anonymous_namespace)::bindgen_make_fortran_array_view<4ul>
          (bindgen_fortran_array_descriptor *descriptor,StaticHypercube<4UL> *param_2)

{
  runtime_error *prVar1;
  int local_30;
  int i;
  StaticHypercube<4UL> *param_1_local;
  bindgen_fortran_array_descriptor *descriptor_local;
  
  if (descriptor->type != bindgen_fk_Double) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"type does not match");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_30 = 0;
  while( true ) {
    if (descriptor->rank <= local_30) {
      anon_unknown_0::StaticHypercube<4UL>::StaticHypercube
                ((StaticHypercube<4UL> *)&descriptor_local,(double *)descriptor->data);
      return (StaticHypercube<4UL>)(double *)descriptor_local;
    }
    if (descriptor->dims[local_30] != 2) break;
    local_30 = local_30 + 1;
  }
  prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar1,"dimensions must be 2");
  __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

StaticHypercube<Rank> bindgen_make_fortran_array_view(
                bindgen_fortran_array_descriptor *descriptor, StaticHypercube<Rank> *) {
                if (descriptor->type != bindgen_fk_Double) {
                    throw std::runtime_error("type does not match");
                }
                for (int i = 0; i < descriptor->rank; ++i)
                    if (descriptor->dims[i] != 2)
                        throw std::runtime_error("dimensions must be 2");

                return StaticHypercube<Rank>{reinterpret_cast<double *>(descriptor->data)};
            }